

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::RestrictedLogSoftmax::backward_impl
          (RestrictedLogSoftmax *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  bool bVar1;
  reference puVar2;
  CoeffReturnType pfVar3;
  Scalar *pSVar4;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_RDI;
  int in_R8D;
  float fVar5;
  uint ind_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1_1;
  uint ind;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  float z;
  float in_stack_fffffffffffffef8;
  float in_stack_fffffffffffffefc;
  Index in_stack_ffffffffffffff10;
  Index in_stack_ffffffffffffff18;
  DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
  *in_stack_ffffffffffffff20;
  Tensor *in_stack_ffffffffffffff28;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_88;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *local_80;
  uint local_54;
  uint *local_50;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_48;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *local_40;
  float local_34;
  
  if (in_R8D == 0) {
    local_34 = 0.0;
    local_40 = in_RDI + 10;
    local_48._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    local_50 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (in_RDI,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      if (!bVar1) break;
      puVar2 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&local_48);
      local_54 = *puVar2;
      Tensor::operator*(in_stack_ffffffffffffff28);
      pfVar3 = Eigen::
               DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>
               ::operator()(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                            in_stack_ffffffffffffff10);
      local_34 = *pfVar3 + local_34;
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&local_48);
    }
    local_80 = in_RDI + 10;
    local_88._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (in_RDI,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator*(&local_88);
      Tensor::operator*(in_stack_ffffffffffffff28);
      pfVar3 = Eigen::
               DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>
               ::operator()(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                            in_stack_ffffffffffffff10);
      in_stack_fffffffffffffef8 = *pfVar3;
      Tensor::operator*(in_stack_ffffffffffffff28);
      pfVar3 = Eigen::
               DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>
               ::operator()(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                            in_stack_ffffffffffffff10);
      fVar5 = expf(*pfVar3);
      in_stack_fffffffffffffefc = -fVar5 * local_34 + in_stack_fffffffffffffef8;
      Tensor::operator*(in_stack_ffffffffffffff28);
      pSVar4 = Eigen::
               DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                             *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                            in_stack_ffffffffffffff10);
      *pSVar4 = in_stack_fffffffffffffefc + *pSVar4;
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&local_88);
    }
    return;
  }
  __assert_fail("i == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/cnn/cnn/nodes.cc"
                ,0x5fa,
                "virtual void cnn::RestrictedLogSoftmax::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
               );
}

Assistant:

void RestrictedLogSoftmax::backward_impl(const vector<const Tensor*>& xs,
                            const Tensor& fx,
                            const Tensor& dEdf,
                            unsigned i,
                            Tensor& dEdxi) const {
  assert(i == 0);
#ifdef HAVE_CUDA
  throw std::runtime_error("RestrictedLogSoftmax not yet implemented for CUDA");
#else
  float z = 0;
  for (auto ind : denom)
    z += (*dEdf)(ind, 0);
  for (auto ind : denom)
    (*dEdxi)(ind, 0) += (*dEdf)(ind, 0) - expf((*fx)(ind, 0)) * z;
#endif
}